

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskExporter.cpp
# Opt level: O2

void TaskExporter::exportTasks(vector<TaskNode,_std::allocator<TaskNode>_> *taskNodes,ostream *out)

{
  pointer pTVar1;
  string *psVar2;
  ostream *poVar3;
  TaskNode *taskNode;
  pointer this;
  
  pTVar1 = (taskNodes->super__Vector_base<TaskNode,_std::allocator<TaskNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (taskNodes->super__Vector_base<TaskNode,_std::allocator<TaskNode>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pTVar1; this = this + 1) {
    psVar2 = TaskNode::getName_abi_cxx11_(this);
    poVar3 = std::operator<<(out,(string *)psVar2);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void TaskExporter::exportTasks(const std::vector<TaskNode> &taskNodes, std::ostream &out) {
    for (const auto &taskNode : taskNodes)
        out << taskNode.getName() << "\n";
}